

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t zeGetImageProcAddrTable(ze_api_version_t version,ze_image_dditable_t *pDdiTable)

{
  ze_result_t result;
  ze_image_dditable_t *dditable;
  ze_image_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (ze_image_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)tracing_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
    _DAT_002da5b0 = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties = tracing_layer::zeImageGetProperties;
    _DAT_002da5b8 = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate = tracing_layer::zeImageCreate;
    _DAT_002da5c0 = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy = tracing_layer::zeImageDestroy;
    _DAT_002da5c8 = pDdiTable->pfnGetAllocPropertiesExt;
    pDdiTable->pfnGetAllocPropertiesExt = tracing_layer::zeImageGetAllocPropertiesExt;
    DAT_002da5d0 = pDdiTable->pfnViewCreateExt;
    pDdiTable->pfnViewCreateExt = tracing_layer::zeImageViewCreateExt;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetImageProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_image_dditable_t* pDdiTable                  ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.Image;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnGetProperties                            = pDdiTable->pfnGetProperties;
    pDdiTable->pfnGetProperties                          = tracing_layer::zeImageGetProperties;

    dditable.pfnCreate                                   = pDdiTable->pfnCreate;
    pDdiTable->pfnCreate                                 = tracing_layer::zeImageCreate;

    dditable.pfnDestroy                                  = pDdiTable->pfnDestroy;
    pDdiTable->pfnDestroy                                = tracing_layer::zeImageDestroy;

    dditable.pfnGetAllocPropertiesExt                    = pDdiTable->pfnGetAllocPropertiesExt;
    pDdiTable->pfnGetAllocPropertiesExt                  = tracing_layer::zeImageGetAllocPropertiesExt;

    dditable.pfnViewCreateExt                            = pDdiTable->pfnViewCreateExt;
    pDdiTable->pfnViewCreateExt                          = tracing_layer::zeImageViewCreateExt;

    return result;
}